

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

void invocation_message(void)

{
  boolean bVar1;
  obj *obj;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  obj *otmp;
  char buf [256];
  char *pcStack_10;
  int dist_invocation_pos;
  char *strange_vibration;
  
  bVar1 = Invocation_lev(&u.uz);
  if (bVar1 != '\0') {
    buf._252_4_ = dist2((int)inv_pos.x,(int)inv_pos.y,(int)u.ux,(int)u.uy);
    if (buf._252_4_ == 0) {
      pcStack_10 = "strange vibration";
    }
    else if ((int)buf._252_4_ < 3) {
      pcStack_10 = "weak trembling";
    }
    else {
      pcStack_10 = "faint trembling";
    }
    if (((int)buf._252_4_ < 5) && (bVar1 = On_stairs(inv_pos.x,inv_pos.y), bVar1 == '\0')) {
      obj = carrying(0x10b);
      nomul(0,(char *)0x0);
      if (u.usteed == (monst *)0x0) {
        if ((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
            ((youmonst.data)->mlet != '\x05')) &&
           ((u.uprops[0x3c].extrinsic == 0 && (((youmonst.data)->mflags1 & 1) == 0)))) {
          pcVar2 = body_part(5);
          pcVar2 = makeplural(pcVar2);
          sprintf((char *)&otmp,"under your %s",pcVar2);
        }
        else {
          strcpy((char *)&otmp,"beneath you");
        }
      }
      else {
        pcVar2 = y_monnam(u.usteed);
        sprintf((char *)&otmp,"beneath %s",pcVar2);
      }
      pline("You feel a %s %s.",pcStack_10,&otmp);
      bVar1 = invocation_pos(&u.uz,u.ux,u.uy);
      if (((bVar1 != '\0') && (obj != (obj *)0x0)) &&
         ((obj->spe == '\a' && ((*(uint *)&obj->field_0x4a >> 0x13 & 1) != 0)))) {
        pcVar2 = xname(obj);
        pcVar2 = The(pcVar2);
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          bVar4 = false;
          if (ublindf != (obj *)0x0) {
            bVar4 = ublindf->oartifact == '\x1d';
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        pcVar3 = "glows with a strange light";
        if (bVar4) {
          pcVar3 = "throbs palpably";
        }
        pline("%s %s!",pcVar2,pcVar3);
      }
    }
  }
  return;
}

Assistant:

void invocation_message(void)
{
	/* a special clue-msg when near the Invocation position */
	if (Invocation_lev(&u.uz)) {
	    const char *strange_vibration;
	    int dist_invocation_pos = distu(inv_pos.x, inv_pos.y);

	    /* different message depending on the distance to the vibrating square
	       ..f..
	       .www.
	       fwswf
	       .www.
	       ..f..
	     */
	    if (dist_invocation_pos == 0)
		strange_vibration = "strange vibration";
	    else if (dist_invocation_pos <= 2)
		strange_vibration = "weak trembling";
	    else
		strange_vibration = "faint trembling";

	    /* within close proximity of the vibrating square */
	    if (dist_invocation_pos <= 4 && !On_stairs(inv_pos.x, inv_pos.y)) {
		char buf[BUFSZ];
		struct obj *otmp = carrying(CANDELABRUM_OF_INVOCATION);

		nomul(0, NULL);		/* stop running or travelling */

		if (u.usteed)
		    sprintf(buf, "beneath %s", y_monnam(u.usteed));
		else if (Levitation || Flying)
		    strcpy(buf, "beneath you");
		else
		    sprintf(buf, "under your %s", makeplural(body_part(FOOT)));
		pline("You feel a %s %s.", strange_vibration, buf);

		/* only report if on the vibrating square */
		if (invocation_pos(&u.uz, u.ux, u.uy) &&
		    otmp && otmp->spe == 7 && otmp->lamplit) {
		    pline("%s %s!", The(xname(otmp)),
			Blind ? "throbs palpably" : "glows with a strange light");
		}
	    }
	}
}